

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O2

ares_bool_t ares_uri_chis_fragment(char x)

{
  ares_bool_t aVar1;
  undefined7 in_register_00000039;
  
  if (((uint)CONCAT71(in_register_00000039,x) | 0x10) == 0x3f) {
    return ARES_TRUE;
  }
  aVar1 = ares_uri_chis_path(x);
  return aVar1;
}

Assistant:

static ares_bool_t ares_uri_chis_fragment(char x)
{
  switch (x) {
    case '/':
      return ARES_TRUE;
    case '?':
      return ARES_TRUE;
    default:
      break;
  }
  return ares_uri_chis_path(x);
}